

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5TextureGatherOffset.cpp
# Opt level: O0

void __thiscall
glcts::GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest::prepareVertexBuffersData
          (GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest *this,
          vector<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
          *vertex_buffer_infos)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  int iVar5;
  undefined1 local_48 [8];
  VertexBufferInfo info;
  uint i;
  GLint max_ptgo;
  GLint min_ptgo;
  uint n_total_components;
  vector<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
  *vertex_buffer_infos_local;
  GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest *this_local;
  
  iVar1 = (this->super_GPUShader5TextureGatherOffsetDepthTestBase).
          super_GPUShader5TextureGatherOffsetTestBase.m_min_texture_gather_offset;
  info._28_4_ = (this->super_GPUShader5TextureGatherOffsetDepthTestBase).
                super_GPUShader5TextureGatherOffsetTestBase.m_max_texture_gather_offset;
  std::vector<int,_std::allocator<int>_>::resize(&this->m_offsets_buffer_data,0x100);
  for (info.data_size = 0; info.data_size < 0x100; info.data_size = info.data_size + 1) {
    iVar2 = rand();
    iVar5 = info._28_4_ - iVar1;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->m_offsets_buffer_data,(ulong)info.data_size);
    *pvVar3 = iVar2 % (iVar5 + 1) + iVar1;
  }
  local_48 = (undefined1  [8])0x2c2b8ba;
  info.attribute_name._0_4_ = 2;
  info.attribute_name._4_4_ = 0x1404;
  info._8_8_ = std::vector<int,_std::allocator<int>_>::operator[](&this->m_offsets_buffer_data,0);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->m_offsets_buffer_data);
  info.data._0_4_ = (undefined4)(sVar4 << 2);
  std::
  vector<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
  ::push_back(vertex_buffer_infos,(value_type *)local_48);
  return;
}

Assistant:

void GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest::prepareVertexBuffersData(
	std::vector<VertexBufferInfo>& vertex_buffer_infos)
{
	/* Constants for offsets and size of buffer */
	const unsigned int n_total_components = m_n_vertices * m_n_offsets_components;

	/* Limits used to generate offsets */
	const glw::GLint min_ptgo = m_min_texture_gather_offset;
	const glw::GLint max_ptgo = m_max_texture_gather_offset;

	/* Storage for offsets */
	m_offsets_buffer_data.resize(n_total_components);

	/* Generate offsets */
	for (unsigned int i = 0; i < n_total_components; ++i)
	{
		m_offsets_buffer_data[i] = (rand() % (max_ptgo - min_ptgo + 1)) + min_ptgo;
	}

	/* Setup offsets VB info */
	VertexBufferInfo info;

	info.attribute_name = m_offsets_attribute_name;
	info.n_components   = m_n_offsets_components;
	info.type			= GL_INT;
	info.data			= &m_offsets_buffer_data[0];
	info.data_size		= (glw::GLuint)(m_offsets_buffer_data.size() * sizeof(glw::GLint));

	/* Add VB info to vector */
	vertex_buffer_infos.push_back(info);
}